

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qladisp.cpp
# Opt level: O1

void PrintDebugStream(stringstream *debugStream)

{
  ostream *poVar1;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_38,local_30);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  std::ios::clear((int)debugStream + (int)*(undefined8 *)(*(long *)debugStream + -0x18));
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  std::__cxx11::stringbuf::str((string *)(debugStream + 0x18));
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void PrintDebugStream(std::stringstream &debugStream)
{
    std::cerr << debugStream.str() << std::endl;
    debugStream.clear();
    debugStream.str("");
}